

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMultiCond.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionMultiCond::InstructionMultiCond
          (InstructionMultiCond *this,Context *cx,Vec<Hpipe::Cond> *conds,int off_data)

{
  Context local_90;
  
  Context::Context(&local_90,cx);
  Instruction::Instruction(&this->super_Instruction,&local_90);
  Context::~Context(&local_90);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__InstructionMultiCond_001972d0;
  std::vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>::vector
            (&(this->conds).super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>,
             &conds->super_vector<Hpipe::Cond,_std::allocator<Hpipe::Cond>_>);
  this->off_data = off_data;
  return;
}

Assistant:

InstructionMultiCond::InstructionMultiCond( const Context &cx, const Vec<Cond> &conds, int off_data ) : Instruction( cx ), conds( conds ), off_data( off_data ) {
}